

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O0

word Extra_Truth6MinimumRoundMany1(word t,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  word wVar1;
  uint local_5c;
  undefined8 uStack_58;
  uint uCanonPhase1;
  char pCanonPerm1 [16];
  word tMin;
  word tMin0;
  uint *pCanonPhase_local;
  char *pCanonPerm_local;
  int *pStore_local;
  word t_local;
  
  switch(*pCanonPhase >> 7) {
  case 0:
    t_local = Extra_Truth6MinimumRoundMany_noEBFC(t,pStore,pCanonPerm,pCanonPhase);
    break;
  case 1:
    t_local = Extra_Truth6MinimumRoundMany(t,pStore,pCanonPerm,pCanonPhase);
    break;
  case 2:
    local_5c = *pCanonPhase ^ 0x40;
    uStack_58 = *(undefined8 *)pCanonPerm;
    pCanonPerm1._0_8_ = *(undefined8 *)(pCanonPerm + 8);
    t_local = Extra_Truth6MinimumRoundMany_noEBFC(t,pStore,pCanonPerm,pCanonPhase);
    wVar1 = Extra_Truth6MinimumRoundMany_noEBFC
                      (t ^ 0xffffffffffffffff,pStore,(char *)&stack0xffffffffffffffa8,&local_5c);
    if (wVar1 < t_local) {
      *pCanonPhase = local_5c;
      *(undefined8 *)pCanonPerm = uStack_58;
      *(undefined8 *)(pCanonPerm + 8) = pCanonPerm1._0_8_;
      t_local = wVar1;
    }
    break;
  case 3:
    local_5c = *pCanonPhase ^ 0x40;
    uStack_58 = *(undefined8 *)pCanonPerm;
    pCanonPerm1._0_8_ = *(undefined8 *)(pCanonPerm + 8);
    t_local = Extra_Truth6MinimumRoundMany(t,pStore,pCanonPerm,pCanonPhase);
    wVar1 = Extra_Truth6MinimumRoundMany
                      (t ^ 0xffffffffffffffff,pStore,(char *)&stack0xffffffffffffffa8,&local_5c);
    if (wVar1 < t_local) {
      *pCanonPhase = local_5c;
      *(undefined8 *)pCanonPerm = uStack_58;
      *(undefined8 *)(pCanonPerm + 8) = pCanonPerm1._0_8_;
      t_local = wVar1;
    }
    break;
  default:
    t_local = Extra_Truth6MinimumRoundMany(t,pStore,pCanonPerm,pCanonPhase);
  }
  return t_local;
}

Assistant:

word Extra_Truth6MinimumRoundMany1( word t, int* pStore, char* pCanonPerm, unsigned* pCanonPhase )
{
    word tMin0, tMin=t;
    char pCanonPerm1[16];
    unsigned uCanonPhase1;
    switch ((* pCanonPhase) >> 7)
    {
    case 0 :
        {

    	    return Extra_Truth6MinimumRoundMany_noEBFC( t, pStore, pCanonPerm, pCanonPhase);
        }
    case 1 :
        {            
            return Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
        }
    case 2 :
        { 
            uCanonPhase1 = *pCanonPhase;
            uCanonPhase1 ^= (1 << 6);
            memcpy(pCanonPerm1,pCanonPerm,sizeof(char)*16);
            tMin0 = Extra_Truth6MinimumRoundMany_noEBFC( t, pStore, pCanonPerm, pCanonPhase);
            tMin =  Extra_Truth6MinimumRoundMany_noEBFC( ~t, pStore, pCanonPerm1, &uCanonPhase1);
            if(tMin0 <=tMin)
                return tMin0;
            else
            {
                *pCanonPhase = uCanonPhase1;
                memcpy(pCanonPerm,pCanonPerm1,sizeof(char)*16);
                return tMin;
            }
        }
    case 3 :
        {
            uCanonPhase1 = *pCanonPhase;
            uCanonPhase1 ^= (1 << 6);
            memcpy(pCanonPerm1,pCanonPerm,sizeof(char)*16);
            tMin0 = Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
            tMin =  Extra_Truth6MinimumRoundMany( ~t, pStore, pCanonPerm1, &uCanonPhase1);
            if(tMin0 <=tMin)
                return tMin0;
            else
            {
                *pCanonPhase = uCanonPhase1;
                memcpy(pCanonPerm,pCanonPerm1,sizeof(char)*16);
                return tMin;
            }
        }
    }
    return Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
}